

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O0

bool __thiscall
astar::AStar::InOpenZone
          (AStar *this,
          priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
          *pc,Point *point)

{
  bool bVar1;
  const_reference pointCost;
  undefined1 local_48 [8];
  value_type tmp;
  Point *point_local;
  priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
  *pc_local;
  AStar *this_local;
  
  tmp.parent.super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)point;
  do {
    bVar1 = std::
            priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
            ::empty(pc);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = 0;
      break;
    }
    pointCost = std::
                priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
                ::top(pc);
    PointCost::PointCost((PointCost *)local_48,pointCost);
    std::
    priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
    ::pop(pc);
    bVar1 = Point::operator==((Point *)tmp.parent.
                                       super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi,(Point *)local_48);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    PointCost::~PointCost((PointCost *)local_48);
  } while (!bVar1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InOpenZone(std::priority_queue<PointCost> pc, const Point& point)
    {
        while (!pc.empty()) {
            auto tmp = pc.top();
            pc.pop();
            if (point == tmp.point) {
                return true;
            }
        }
        return false;
    }